

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
VersionNode<(cmSystemTools::CompareOp)5>::Evaluate
          (string *__return_storage_ptr__,VersionNode<(cmSystemTools::CompareOp)5> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *param_2,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  pointer pbVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar2 = cmSystemTools::VersionCompare
                    (OP_GREATER_EQUAL,(pbVar1->_M_dataplus)._M_p,pbVar1[1]._M_dataplus._M_p);
  pcVar4 = "0";
  if (bVar2) {
    pcVar4 = "1";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = "";
  if (bVar2) {
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* /*context*/,
    const GeneratorExpressionContent* /*content*/,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    return cmSystemTools::VersionCompare(Op, parameters.front().c_str(),
                                         parameters[1].c_str())
      ? "1"
      : "0";
  }